

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

int divsufsortxx::substring::compare_last<char*,bitmap::BitmapArray<long>::iterator>
              (char *T,iterator p1,iterator p2,value_type depth,value_type size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  BitmapArray<long> *pBVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  
  pBVar4 = p2.array_;
  iVar1 = (*((p1.array_)->super_Bitmap)._vptr_Bitmap[5])(p1.array_,p1.pos_);
  pcVar8 = T + CONCAT44(extraout_var,iVar1) + depth;
  iVar2 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,p2.pos_);
  pcVar9 = T + CONCAT44(extraout_var_00,iVar2) + depth;
  iVar3 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,p2.pos_ + 1);
  pcVar5 = T + CONCAT44(extraout_var_01,iVar3) + 2;
  bVar10 = pcVar9 < pcVar5;
  bVar11 = pcVar8 < T + size;
  if (((bVar11) && (pcVar9 < pcVar5)) && (*pcVar8 == *pcVar9)) {
    pcVar6 = T + CONCAT44(extraout_var_00,iVar2);
    pcVar7 = T + CONCAT44(extraout_var,iVar1);
    do {
      pcVar7 = pcVar7 + 1;
      pcVar6 = pcVar6 + 1;
      pcVar8 = pcVar7 + depth;
      pcVar9 = pcVar6 + depth;
      bVar10 = pcVar9 < pcVar5;
      bVar11 = pcVar8 < T + size;
      if ((!bVar11) || (pcVar5 <= pcVar9)) break;
    } while (*pcVar8 == *pcVar9);
  }
  if (bVar11) {
    iVar1 = 1;
    if (bVar10) {
      iVar1 = (uint)(*pcVar9 < *pcVar8) * 2 + -1;
    }
  }
  else {
    iVar1 = -(uint)bVar10;
  }
  return iVar1;
}

Assistant:

int compare_last(
    StringIterator_type T, const SAIterator_type p1, const SAIterator_type p2,
    typename std::iterator_traits<SAIterator_type>::value_type depth,
    typename std::iterator_traits<SAIterator_type>::value_type size) {
  StringIterator_type U1 = T + depth + *p1, U2 = T + depth + *p2, U1n = T
      + size, U2n = T + *(p2 + 1) + 2;
  for (; (U1 < U1n) && (U2 < U2n) && (*U1 == *U2); ++U1, ++U2) {
  }

  return U1 < U1n ? (U2 < U2n ? (*U2 < *U1) * 2 - 1 : 1) :
//        (U2 < U2n ? *U1 - *U2 : 1) :
      (U2 < U2n ? -1 : 0);
}